

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sndseq.cpp
# Opt level: O1

void __thiscall DSeqActorNode::Destroy(DSeqActorNode *this)

{
  AActor *actor;
  
  if (-1 < (this->super_DSeqNode).m_StopSound) {
    actor = (this->m_Actor).field_0.p;
    if ((actor != (AActor *)0x0) &&
       (((actor->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
      (this->m_Actor).field_0.p = (AActor *)0x0;
      actor = (AActor *)0x0;
    }
    S_StopSound(actor,4);
  }
  if (0 < (this->super_DSeqNode).m_StopSound) {
    (*(this->super_DSeqNode).super_DObject._vptr_DObject[7])(this,0);
  }
  DSeqNode::Destroy(&this->super_DSeqNode);
  return;
}

Assistant:

void DSeqActorNode::Destroy ()
{
	if (m_StopSound >= 0)
		S_StopSound (m_Actor, CHAN_BODY);
	if (m_StopSound >= 1)
		MakeSound (0, m_StopSound);
	Super::Destroy();
}